

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::TextureSubImage<3u,true>
          (StorageAndSubImageTest *this,GLenum target,GLuint texture,GLint level,
          GLint internalformat,GLsizei width,GLsizei height,GLsizei depth,GLenum format,GLenum type,
          GLvoid *data)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_238;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8 [2];
  MessageBuilder local_1d8;
  int local_54;
  long lStack_50;
  GLenum error;
  Functions *gl;
  GLint local_40;
  GLsizei width_local;
  GLint internalformat_local;
  GLint level_local;
  GLuint texture_local;
  GLenum target_local;
  StorageAndSubImageTest *this_local;
  
  gl._4_4_ = width;
  local_40 = internalformat;
  width_local = level;
  internalformat_local = texture;
  level_local = target;
  _texture_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_50 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_50 + 0x14a0))
            (internalformat_local,width_local,0,0,0,gl._4_4_,height,depth,format,type,data);
  local_54 = (**(code **)(lStack_50 + 0x800))();
  bVar4 = local_54 == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1d8,
                        (char (*) [50])"glTextureSubImage3D unexpectedly generated error ");
    EVar5 = glu::getErrorStr(local_54);
    local_208 = EVar5.m_getName;
    local_200 = EVar5.m_value;
    local_1f8[0].m_getName = local_208;
    local_1f8[0].m_value = local_200;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1f8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [25])" during test with level ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&width_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", width ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])", height ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&height);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", depth ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&depth);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])", format ");
    EVar5 = glu::getTextureFormatStr(format);
    local_228 = EVar5.m_getName;
    local_220 = EVar5.m_value;
    local_218.m_getName = local_228;
    local_218.m_value = local_220;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_218);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])" and type ");
    EVar5 = glu::getTypeStr(type);
    local_238.m_getName = EVar5.m_getName;
    local_238.m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_238);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    CleanTexture(this);
    CleanErrors(this);
  }
  return bVar4;
}

Assistant:

bool StorageAndSubImageTest::TextureSubImage<3, true>(glw::GLenum target, glw::GLuint texture, glw::GLint level,
													  glw::GLint internalformat, glw::GLsizei width,
													  glw::GLsizei height, glw::GLsizei depth, glw::GLenum format,
													  glw::GLenum type, const glw::GLvoid* data)
{
	(void)target;
	(void)internalformat;
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Action. */
	gl.textureSubImage3D(texture, level, 0, 0, 0, width, height, depth, format, type, data);

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTextureSubImage3D unexpectedly generated error " << glu::getErrorStr(error)
			<< " during test with level " << level << ", width " << width << ", height " << height << ", depth "
			<< depth << ", format " << glu::getTextureFormatStr(format) << " and type " << glu::getTypeStr(type) << "."
			<< tcu::TestLog::EndMessage;

		CleanTexture();
		CleanErrors();

		return false;
	}

	return true;
}